

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neural_net.cpp
# Opt level: O3

void __thiscall Net::learn(Net *this,int global_iterations)

{
  undefined8 *puVar1;
  void *pvVar2;
  pointer pvVar3;
  pointer pdVar4;
  iterator iVar5;
  pointer pdVar6;
  iterator iVar7;
  bool bVar8;
  pointer piVar9;
  pointer pvVar10;
  ostream *poVar11;
  int iVar12;
  pointer piVar13;
  pointer pvVar14;
  pointer piVar15;
  ulong uVar16;
  int *piVar17;
  bool bVar18;
  long lVar19;
  int iVar20;
  ulong unaff_RBP;
  long lVar21;
  uint uVar22;
  int iVar23;
  ulong uVar24;
  Table *this_00;
  double dVar25;
  undefined1 auVar26 [16];
  vector<double,_std::allocator<double>_> y;
  vector<int,_std::allocator<int>_> cur_shuffle;
  double divisor;
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  derivative;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  bias_derivative;
  vector<double,_std::allocator<double>_> local_168;
  vector<double,_std::allocator<double>_> local_148;
  int *local_128;
  iterator iStack_120;
  int *local_118;
  int local_10c;
  ulong local_108;
  ulong local_100;
  double local_f8;
  int local_f0;
  uint local_ec;
  Table *local_e8;
  double local_e0;
  double local_d8;
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  local_d0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_b8;
  double local_a0;
  double local_98;
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  *local_90;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_88;
  Table *local_80;
  vector<double,_std::allocator<double>_> local_78;
  vector<double,_std::allocator<double>_> local_60;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_48;
  
  if (0 < global_iterations) {
    local_88 = &this->init_biases;
    local_90 = &this->init;
    this_00 = &this->samples;
    local_e8 = &this->answers;
    local_a0 = (double)global_iterations;
    piVar9 = (this->shuffler).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_100 = 1;
    piVar13 = (this->shuffler).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish;
    local_10c = global_iterations;
    local_80 = this_00;
    do {
      piVar15 = piVar9;
      if ((long)piVar13 - (long)piVar9 != 0) {
        uVar16 = (long)piVar13 - (long)piVar9 >> 2;
        local_f0 = (int)local_100 + (int)(local_100 / 0x32) * -0x32;
        local_98 = (double)(int)local_100 / local_a0;
        unaff_RBP = CONCAT71((int7)(unaff_RBP >> 8),1);
        local_108 = 0;
        do {
          local_ec = (uint)unaff_RBP;
          local_128 = (int *)0x0;
          iStack_120._M_current = (int *)0x0;
          local_118 = (int *)0x0;
          iVar23 = (int)local_108;
          uVar22 = this->shot + iVar23;
          if (uVar16 < (ulong)(long)(int)uVar22) {
            uVar24 = (ulong)iVar23;
            uVar16 = local_108;
            if (uVar24 < (ulong)((long)piVar13 - (long)piVar9 >> 2)) {
              lVar19 = uVar24 * 4;
              do {
                if (iStack_120._M_current == local_118) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)&local_128,iStack_120,
                             (int *)((long)piVar9 + lVar19));
                  piVar9 = (this->shuffler).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  piVar13 = (this->shuffler).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish;
                }
                else {
                  *iStack_120._M_current = *(int *)((long)piVar9 + lVar19);
                  iStack_120._M_current = iStack_120._M_current + 1;
                }
                uVar24 = uVar24 + 1;
                lVar19 = lVar19 + 4;
                uVar16 = uVar24;
              } while (uVar24 < (ulong)((long)piVar13 - (long)piVar9 >> 2));
            }
          }
          else {
            uVar16 = (ulong)uVar22;
            if (0 < this->shot) {
              lVar21 = (long)iVar23;
              lVar19 = lVar21 * 4;
              local_108 = (ulong)uVar22;
              do {
                piVar17 = (int *)((long)(this->shuffler).
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start + lVar19);
                if (iStack_120._M_current == local_118) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)&local_128,iStack_120,piVar17);
                }
                else {
                  *iStack_120._M_current = *piVar17;
                  iStack_120._M_current = iStack_120._M_current + 1;
                }
                lVar21 = lVar21 + 1;
                uVar16 = (long)iVar23 + (long)this->shot;
                lVar19 = lVar19 + 4;
              } while (lVar21 < (long)uVar16);
            }
          }
          local_108 = uVar16;
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::vector(&local_b8,local_88);
          std::
          vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
          ::vector(&local_d0,local_90);
          iVar7._M_current = iStack_120._M_current;
          iVar5._M_current = local_128;
          for (piVar17 = local_128; piVar17 != iVar7._M_current; piVar17 = piVar17 + 1) {
            iVar23 = *piVar17;
            pvVar14 = (this->mesh).
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (*(pointer *)
                 ((long)&(pvVar14->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data + 8) !=
                (pvVar14->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start) {
              uVar16 = 0;
              do {
                dVar25 = Table::get_value(this_00,(int)uVar16,iVar23);
                pvVar14 = (this->mesh).
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                lVar19 = *(long *)&(pvVar14->super__Vector_base<double,_std::allocator<double>_>).
                                   _M_impl.super__Vector_impl_data;
                *(double *)(lVar19 + uVar16 * 8) = dVar25;
                uVar16 = uVar16 + 1;
              } while (uVar16 < (ulong)((long)*(pointer *)
                                               ((long)&(pvVar14->
                                                                                                              
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  )._M_impl.super__Vector_impl_data + 8) - lVar19 >>
                                       3));
            }
            pvVar10 = (this->mesh).
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            if (1 < (int)((ulong)((long)pvVar10 - (long)pvVar14) >> 3) * -0x55555555) {
              iVar20 = 1;
              do {
                propagate_front(this,iVar20);
                pvVar10 = (this->mesh).
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                iVar20 = iVar20 + 1;
                iVar12 = (int)((ulong)((long)pvVar10 -
                                      (long)(this->mesh).
                                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 3);
              } while (SBORROW4(iVar20,iVar12 * -0x55555555) != iVar20 + iVar12 * 0x55555555 < 0);
            }
            local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            std::vector<double,_std::allocator<double>_>::vector
                      (&local_168,
                       (long)pvVar10[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                       (long)pvVar10[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl
                             .super__Vector_impl_data._M_start >> 3,
                       (value_type_conflict2 *)&local_148,(allocator_type *)&local_d8);
            if (this->function_type == TANH) {
              pvVar14 = (this->mesh).
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0xbff0000000000000;
              std::vector<double,_std::allocator<double>_>::_M_fill_assign
                        (&local_168,
                         (long)pvVar14[-1].super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)pvVar14[-1].super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 3,
                         (value_type_conflict2 *)&local_148);
            }
            dVar25 = Table::get_value(local_e8,0,iVar23);
            local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[(int)dVar25] = 1.0;
            iVar23 = (int)((ulong)((long)(this->mesh).
                                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->mesh).
                                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                     -0x55555555;
            if (iVar23 < 2) {
LAB_001074d6:
              operator_delete(local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_168.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_168.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            else {
              uVar22 = iVar23 + 1;
              do {
                std::vector<double,_std::allocator<double>_>::vector(&local_78,&local_168);
                propagate_back(&local_148,this,uVar22 - 2,&local_78,&local_d0,&local_b8);
                pdVar6 = local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
                pdVar4 = local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start =
                     local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
                local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage =
                     local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
                local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                if ((pdVar4 != (pointer)0x0) &&
                   (operator_delete(pdVar4,(long)pdVar6 - (long)pdVar4),
                   local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start != (pointer)0x0)) {
                  operator_delete(local_148.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_148.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage -
                                  (long)local_148.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start);
                }
                if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_78.super__Vector_base<double,_std::allocator<double>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_78.super__Vector_base<double,_std::allocator<double>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                uVar22 = uVar22 - 1;
              } while (2 < uVar22);
              if (local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) goto LAB_001074d6;
            }
            iVar5._M_current = iStack_120._M_current;
          }
          lVar19 = (long)iVar5._M_current - (long)local_128 >> 2;
          auVar26._8_4_ = (int)((long)iVar5._M_current - (long)local_128 >> 0x22);
          auVar26._0_8_ = lVar19;
          auVar26._12_4_ = 0x45300000;
          local_d8 = 1.0 / ((auVar26._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)lVar19) - 4503599627370496.0));
          if (1 < (int)((ulong)((long)(this->mesh).
                                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->mesh).
                                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555)
          {
            dVar25 = 4.94065645841247e-324;
            lVar19 = 0x18;
            do {
              local_f8 = dVar25;
              mult_matrix_on_constant<double>
                        (&local_48,
                         (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          *)((long)&((local_d0.
                                      super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + lVar19),&local_d8);
              std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::~vector(&local_48);
              mult_matrix_on_constant<double>
                        (&local_60,
                         (vector<double,_std::allocator<double>_> *)
                         ((long)&((local_b8.
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                 super__Vector_impl_data._M_start + lVar19),&local_d8);
              if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start,
                                (long)local_60.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_60.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
              local_e0 = -1.0;
              mult_matrix_on_constant<double>
                        ((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          *)&local_148,
                         (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          *)((long)&((local_d0.
                                      super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + lVar19),&local_e0);
              local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   *(pointer *)
                    ((long)&((local_d0.
                              super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_end_of_storage + lVar19);
              puVar1 = (undefined8 *)
                       ((long)&((local_d0.
                                 super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start + lVar19);
              local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)*puVar1;
              local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)puVar1[1];
              puVar1 = (undefined8 *)
                       ((long)&((local_d0.
                                 super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start + lVar19);
              *puVar1 = local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
              puVar1[1] = local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish;
              *(pointer *)
               ((long)&((local_d0.
                         super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_end_of_storage + lVar19) =
                   local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
              local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         *)&local_168);
              std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         *)&local_148);
              local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0xbff0000000000000;
              mult_matrix_on_constant<double>
                        (&local_168,
                         (vector<double,_std::allocator<double>_> *)
                         ((long)&((local_b8.
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                 super__Vector_impl_data._M_start + lVar19),(double *)&local_148);
              pvVar2 = *(void **)((long)&((local_b8.
                                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super__Vector_base<double,_std::allocator<double>_>).
                                         _M_impl.super__Vector_impl_data._M_start + lVar19);
              lVar21 = *(long *)((long)&((local_b8.
                                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->
                                        super__Vector_base<double,_std::allocator<double>_>)._M_impl
                                        .super__Vector_impl_data._M_end_of_storage + lVar19);
              puVar1 = (undefined8 *)
                       ((long)&((local_b8.
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                               super__Vector_impl_data._M_start + lVar19);
              *puVar1 = local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
              puVar1[1] = local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish;
              *(pointer *)
               ((long)&((local_b8.
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_end_of_storage + lVar19) =
                   local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
              local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              if ((pvVar2 != (void *)0x0) &&
                 (operator_delete(pvVar2,lVar21 - (long)pvVar2),
                 local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start != (pointer)0x0)) {
                operator_delete(local_168.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_168.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_168.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
              add_matrix<double>((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                  *)&local_148,
                                 (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                  *)((long)&(((this->weights).
                                              super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                            )._M_impl.super__Vector_impl_data + lVar19),
                                 (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                  *)((long)&((local_d0.
                                              super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start + lVar19));
              this_00 = local_80;
              pvVar3 = (this->weights).
                       super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   *(pointer *)
                    ((long)&(pvVar3->
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            )._M_impl.super__Vector_impl_data + lVar19 + 0x10);
              puVar1 = (undefined8 *)
                       ((long)&(pvVar3->
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               )._M_impl.super__Vector_impl_data + lVar19);
              local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)*puVar1;
              local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)puVar1[1];
              puVar1 = (undefined8 *)
                       ((long)&(pvVar3->
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               )._M_impl.super__Vector_impl_data + lVar19);
              *puVar1 = local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
              puVar1[1] = local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish;
              *(pointer *)
               ((long)&(pvVar3->
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       )._M_impl.super__Vector_impl_data + lVar19 + 0x10) =
                   local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
              local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         *)&local_168);
              std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         *)&local_148);
              add_matrix<double>(&local_168,
                                 (vector<double,_std::allocator<double>_> *)
                                 ((long)&(((this->biases).
                                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super__Vector_base<double,_std::allocator<double>_>).
                                         _M_impl.super__Vector_impl_data + lVar19),
                                 (vector<double,_std::allocator<double>_> *)
                                 ((long)&((local_b8.
                                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super__Vector_base<double,_std::allocator<double>_>).
                                         _M_impl.super__Vector_impl_data._M_start + lVar19));
              dVar25 = local_f8;
              pvVar14 = (this->biases).
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pvVar2 = *(void **)((long)&(pvVar14->
                                         super__Vector_base<double,_std::allocator<double>_>).
                                         _M_impl.super__Vector_impl_data + lVar19);
              lVar21 = *(long *)((long)&(pvVar14->
                                        super__Vector_base<double,_std::allocator<double>_>)._M_impl
                                        .super__Vector_impl_data + lVar19 + 0x10);
              puVar1 = (undefined8 *)
                       ((long)&(pvVar14->super__Vector_base<double,_std::allocator<double>_>).
                               _M_impl.super__Vector_impl_data + lVar19);
              *puVar1 = local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
              puVar1[1] = local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish;
              *(pointer *)
               ((long)&(pvVar14->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data + lVar19 + 0x10) =
                   local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
              local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              if ((pvVar2 != (void *)0x0) &&
                 (operator_delete(pvVar2,lVar21 - (long)pvVar2),
                 local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start != (pointer)0x0)) {
                operator_delete(local_168.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_168.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_168.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
              dVar25 = (double)((long)dVar25 + 1);
              lVar19 = lVar19 + 0x18;
            } while ((long)dVar25 <
                     (long)((int)((ulong)((long)(this->mesh).
                                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(this->mesh).
                                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                           -0x55555555));
          }
          unaff_RBP = (ulong)local_ec;
          if ((local_f0 == 0 & (byte)local_ec) != 0) {
            poVar11 = std::ostream::_M_insert<double>(local_98);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"% finished",10);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
            std::ostream::put((char)poVar11);
            std::ostream::flush();
            lVar19 = 0;
            bVar8 = true;
            do {
              bVar18 = bVar8;
              iVar23 = local_128[lVar19];
              pvVar14 = (this->mesh).
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              std::vector<double,_std::allocator<double>_>::vector
                        (&local_168,
                         (long)pvVar14[-1].super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)pvVar14[-1].super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 3,
                         (value_type_conflict2 *)&local_148,(allocator_type *)&local_e0);
              if (this->function_type == TANH) {
                pvVar14 = (this->mesh).
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0xbff0000000000000;
                std::vector<double,_std::allocator<double>_>::_M_fill_assign
                          (&local_168,
                           (long)pvVar14[-1].super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)pvVar14[-1].super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3,
                           (value_type_conflict2 *)&local_148);
              }
              dVar25 = Table::get_value(local_e8,0,iVar23);
              local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[(int)dVar25] = 1.0;
              pvVar14 = (this->mesh).
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              if (1 < (int)((ulong)((long)pvVar14 -
                                   (long)(this->mesh).
                                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                      -0x55555555) {
                iVar23 = 1;
                do {
                  propagate_front(this,iVar23);
                  pvVar14 = (this->mesh).
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                  iVar23 = iVar23 + 1;
                  iVar20 = (int)((ulong)((long)pvVar14 -
                                        (long)(this->mesh).
                                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 3);
                } while (SBORROW4(iVar23,iVar20 * -0x55555555) != iVar23 + iVar20 * 0x55555555 < 0);
              }
              pdVar4 = pvVar14[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              lVar19 = (long)pvVar14[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl
                             .super__Vector_impl_data._M_finish - (long)pdVar4;
              if (lVar19 == 0) {
                local_f8 = 0.0;
              }
              else {
                lVar19 = lVar19 >> 3;
                local_f8 = 0.0;
                lVar21 = 0;
                do {
                  dVar25 = pdVar4[lVar21] -
                           local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar21];
                  local_f8 = local_f8 + dVar25 * dVar25;
                  lVar21 = lVar21 + 1;
                } while (lVar19 + (ulong)(lVar19 == 0) != lVar21);
              }
              poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)local_100);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11," iteration - COST: ",0x13)
              ;
              poVar11 = std::ostream::_M_insert<double>(local_f8);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
              std::ostream::put((char)poVar11);
              std::ostream::flush();
              if (local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_168.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_168.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_168.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
              lVar19 = 1;
              unaff_RBP = 0;
              bVar8 = false;
            } while (bVar18);
          }
          std::
          vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
          ::~vector(&local_d0);
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::~vector(&local_b8);
          if (local_128 != (int *)0x0) {
            operator_delete(local_128,(long)local_118 - (long)local_128);
          }
          piVar9 = (this->shuffler).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar13 = (this->shuffler).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          uVar16 = (long)piVar13 - (long)piVar9 >> 2;
          piVar15 = piVar13;
        } while ((ulong)(long)(int)local_108 < uVar16);
      }
      iVar23 = (int)local_100;
      local_100 = (ulong)(iVar23 + 1);
      piVar13 = piVar15;
    } while (iVar23 != local_10c);
  }
  return;
}

Assistant:

void Net::learn(int global_iterations){
    for (int iteration = 1; iteration <= global_iterations; ++iteration) {
        int cur = 0;
        bool ok = true;
        while (cur < shuffler.size()) {
            // get new shuffled data
            std::vector<int> cur_shuffle;
            if (cur + shot > shuffler.size()) {
                for (; cur < shuffler.size(); ++cur)
                    cur_shuffle.push_back(shuffler[cur]);
            } else {
                for (int i = cur; i < cur + shot; ++i)
                    cur_shuffle.push_back(shuffler[i]);
                cur += shot;
            }
            // front propagate each sample
            std::vector<Layer> bias_derivative = init_biases;
            std::vector<std::vector<Layer> > derivative = init;
            for (int i:cur_shuffle) {
                // front propagation
                for (int x = 0; x < mesh[0].size(); ++x)
                    mesh[0][x] = samples.get_value(x, i);
                for (int layer = 1; layer < (int) mesh.size(); ++layer)
                    propagate_front(layer);

                // right answer
                std::vector<double> y(mesh.back().size(), 0);
                if (function_type == TANH)
                    y.assign(mesh.back().size(), -1);
                y[(int) answers.get_value(0, i)] = 1;

//                // counting cost
//                double cost = 0;
//                for (int op = 0; op < mesh.back().size(); ++op)
//                    cost += (mesh.back()[op] - y[op]) * (mesh.back()[op] - y[op]);
//                std::cout << iteration << " iteration - COST: " << cost << std::endl;

                // back_propagation
                for (int layer = (int) mesh.size() - 1; layer >= 1; --layer)
                    y = propagate_back(layer, y, derivative, bias_derivative);
            }
            // get average sum
            double divisor = 1.0 / (double) cur_shuffle.size();
            for (int layer = 1; layer < (int) mesh.size(); ++layer) {
                mult_matrix_on_constant(derivative[layer], divisor);
                mult_matrix_on_constant(bias_derivative[layer], divisor);
                // updating weights

                derivative[layer] = mult_matrix_on_constant(derivative[layer], -1.0);
                bias_derivative[layer] = mult_matrix_on_constant(bias_derivative[layer], -1.);
                weights[layer] = add_matrix(weights[layer], derivative[layer]);
                biases[layer] = add_matrix(biases[layer], bias_derivative[layer]);
//                threshold(biases[layer], MOD);
//                for (int x = 0; x < mesh[layer].size(); ++x)
//                    threshold(weights[layer][x], MOD);
            }

            // learning results
            if (ok && iteration % 50 == 0) {
                ok = false;
                std::cout << (double)iteration / (double)global_iterations << "% finished" << std::endl;
                for (int j = 0; j < 2; ++j) {
                    int i = cur_shuffle[j];
                    std::vector<double> y(mesh.back().size(), 0);
                    if (function_type == TANH)
                        y.assign(mesh.back().size(), -1);
                    y[(int) answers.get_value(0, i)] = 1;
                    for (int layer = 1; layer < (int) mesh.size(); ++layer)
                        propagate_front(layer);
                    double cost = 0;
                    for (int op = 0; op < mesh.back().size(); ++op)
                        cost += (mesh.back()[op] - y[op]) * (mesh.back()[op] - y[op]);
                    std::cout << iteration << " iteration - COST: " << cost << std::endl;
                }
            }
        }
    }
}